

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sharedbook.c
# Opt level: O2

int vorbis_book_init_decode(codebook *c,static_codebook *s)

{
  size_t __size;
  undefined8 uVar1;
  int iVar2;
  ogg_uint32_t *poVar3;
  ogg_uint32_t *poVar4;
  ogg_int32_t *poVar5;
  int *piVar6;
  char *pcVar7;
  long lVar8;
  byte bVar9;
  long lVar10;
  size_t sVar11;
  byte bVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  ulong uVar19;
  void *__base;
  uint uVar20;
  long lVar21;
  int iVar22;
  int *sparsemap;
  size_t sStack_50;
  long alStack_48 [3];
  
  c->q_min = 0;
  c->q_delta = 0;
  c->dec_firsttable = (ogg_uint32_t *)0x0;
  c->dec_firsttablen = 0;
  c->dec_maxlength = 0;
  c->dec_index = (int *)0x0;
  c->dec_codelengths = (char *)0x0;
  c->valuelist = (ogg_int32_t *)0x0;
  c->codelist = (ogg_uint32_t *)0x0;
  c->used_entries = 0;
  *(undefined8 *)&c->binarypoint = 0;
  c->dim = 0;
  c->entries = 0;
  lVar21 = s->entries;
  lVar10 = 0;
  lVar8 = 0;
  if (0 < lVar21) {
    lVar8 = lVar21;
  }
  alStack_48[1] = 0;
  for (; lVar8 != lVar10; lVar10 = lVar10 + 1) {
    alStack_48[1] = (long)((int)alStack_48[1] + (uint)(0 < s->lengthlist[lVar10]));
  }
  c->entries = lVar21;
  c->used_entries = alStack_48[1];
  c->dim = s->dim;
  if ((int)alStack_48[1] != 0) {
    sStack_50 = 0x11dcf3;
    poVar3 = _make_words(s->lengthlist,lVar21,alStack_48[1]);
    lVar8 = alStack_48[1];
    lVar21 = -(alStack_48[1] * 8 + 0xfU & 0xfffffffffffffff0);
    __base = (void *)((long)alStack_48 + lVar21);
    if (poVar3 == (ogg_uint32_t *)0x0) {
      *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0x11e0b3;
      vorbis_book_clear(c);
      *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0xffffffffffffffff;
      return (int)*(undefined8 *)((long)alStack_48 + lVar21 + -8);
    }
    sVar11 = alStack_48[1] * 4;
    for (lVar10 = 0; sVar11 - lVar10 != 0; lVar10 = lVar10 + 4) {
      uVar16 = *(uint *)((long)poVar3 + lVar10);
      uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
      uVar16 = (uVar16 & 0xf0f0f0f) << 4 | uVar16 >> 4 & 0xf0f0f0f;
      uVar16 = (uVar16 >> 2 & 0x33333333) + (uVar16 & 0x33333333) * 4;
      *(uint *)((long)poVar3 + lVar10) = (uVar16 >> 1 & 0x55555555) + (uVar16 & 0x55555555) * 2;
      *(long *)((long)__base + lVar10 * 2) = lVar10 + (long)poVar3;
    }
    *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 8;
    __size = *(size_t *)((long)alStack_48 + lVar21 + -8);
    alStack_48[2] = sVar11;
    *(undefined8 *)((long)alStack_48 + lVar21 + -8) = 0x11dd9d;
    qsort(__base,lVar8,__size,sort32a);
    lVar21 = alStack_48[2];
    sparsemap = (int *)((long)__base - (alStack_48[1] * 4 + 0xfU & 0xfffffffffffffff0));
    sparsemap[-2] = 0x11ddbf;
    sparsemap[-1] = 0;
    poVar4 = (ogg_uint32_t *)malloc(lVar21);
    lVar21 = alStack_48[1];
    c->codelist = poVar4;
    for (sVar11 = 0; lVar21 != sVar11; sVar11 = sVar11 + 1) {
      sparsemap[(int)((ulong)(*(long *)((long)__base + sVar11 * 8) - (long)poVar3) >> 2)] =
           (int)sVar11;
    }
    for (sVar11 = 0; lVar21 != sVar11; sVar11 = sVar11 + 1) {
      poVar4[sparsemap[sVar11]] = poVar3[sVar11];
    }
    sparsemap[-2] = 0x11de08;
    sparsemap[-1] = 0;
    free(poVar3);
    sparsemap[-2] = 0x11de1a;
    sparsemap[-1] = 0;
    poVar5 = _book_unquantize(s,(int)lVar21,sparsemap,&c->binarypoint);
    lVar21 = alStack_48[2];
    c->valuelist = poVar5;
    sparsemap[-2] = 0x11de27;
    sparsemap[-1] = 0;
    piVar6 = (int *)malloc(lVar21);
    c->dec_index = piVar6;
    lVar21 = s->entries;
    lVar10 = 0;
    lVar8 = 0;
    if (0 < lVar21) {
      lVar8 = lVar21;
    }
    iVar13 = 0;
    for (; sVar11 = (size_t)iVar13, lVar8 != lVar10; lVar10 = lVar10 + 1) {
      if (0 < s->lengthlist[lVar10]) {
        iVar13 = iVar13 + 1;
        piVar6[sparsemap[sVar11]] = (int)lVar10;
      }
    }
    sparsemap[-2] = 0x11de66;
    sparsemap[-1] = 0;
    pcVar7 = (char *)malloc(sVar11);
    c->dec_codelengths = pcVar7;
    uVar16 = 0;
    for (lVar8 = 0; lVar10 = (long)(int)uVar16, lVar8 < lVar21; lVar8 = lVar8 + 1) {
      if (0 < s->lengthlist[lVar8]) {
        uVar16 = uVar16 + 1;
        c->dec_codelengths[sparsemap[lVar10]] = (char)s->lengthlist[lVar8];
        lVar21 = s->entries;
      }
    }
    lVar21 = c->used_entries;
    sparsemap[-2] = 0x11dea4;
    sparsemap[-1] = 0;
    iVar2 = _ilog((uint)lVar21);
    sparsemap[-2] = 0xc;
    sparsemap[-1] = 0;
    iVar13 = (int)*(undefined8 *)(sparsemap + -2);
    if (iVar2 < 0xc) {
      iVar13 = iVar2;
    }
    sparsemap[-2] = 5;
    sparsemap[-1] = 0;
    iVar22 = (int)*(undefined8 *)(sparsemap + -2);
    if (8 < iVar2) {
      iVar22 = iVar13 + -4;
    }
    c->dec_firsttablen = iVar22;
    sparsemap[-2] = 1;
    sparsemap[-1] = 0;
    uVar1 = *(undefined8 *)(sparsemap + -2);
    bVar9 = (byte)iVar22;
    uVar14 = (ulong)(uint)((int)uVar1 << (bVar9 & 0x1f));
    sparsemap[-2] = 4;
    sparsemap[-1] = 0;
    sVar11 = *(size_t *)(sparsemap + -2);
    alStack_48[2] = uVar14;
    sparsemap[-2] = 0x11ded7;
    sparsemap[-1] = 0;
    poVar3 = (ogg_uint32_t *)calloc(uVar14,sVar11);
    c->dec_firsttable = poVar3;
    c->dec_maxlength = 0;
    iVar13 = 0;
    if ((int)uVar16 < 1) {
      uVar16 = 0;
    }
    alStack_48[1] = (ulong)uVar16;
    uVar14 = (ulong)uVar16;
    uVar19 = 0;
    while (uVar15 = uVar19, uVar15 != uVar14) {
      pcVar7 = c->dec_codelengths;
      bVar12 = pcVar7[uVar15];
      iVar17 = (int)(char)bVar12;
      iVar2 = iVar17;
      if (iVar13 < iVar17) {
        c->dec_maxlength = iVar17;
        bVar12 = pcVar7[uVar15];
        iVar2 = (int)(char)bVar12;
        iVar13 = iVar17;
      }
      if (iVar22 < iVar2) {
        uVar19 = uVar15 + 1;
      }
      else {
        uVar16 = c->codelist[uVar15];
        uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
        ;
        uVar16 = (uVar16 & 0xf0f0f0f) << 4 | uVar16 >> 4 & 0xf0f0f0f;
        uVar16 = (uVar16 >> 2 & 0x33333333) + (uVar16 & 0x33333333) * 4;
        for (iVar2 = 0; uVar14 = alStack_48[1], uVar19 = uVar15 + 1,
            iVar2 < (int)uVar1 << (bVar9 - bVar12 & 0x1f); iVar2 = iVar2 + 1) {
          poVar3[iVar2 << (bVar12 & 0x1f) | (uVar16 >> 1 & 0x55555555) + (uVar16 & 0x55555555) * 2]
               = (ogg_uint32_t)(uVar15 + 1);
          bVar12 = pcVar7[uVar15];
        }
      }
    }
    sparsemap[-2] = 0x20;
    sparsemap[-1] = 0;
    uVar1 = *(undefined8 *)(sparsemap + -2);
    uVar14 = 0;
    lVar21 = 0;
    for (iVar13 = 0; iVar13 != (int)alStack_48[2]; iVar13 = iVar13 + 1) {
      uVar20 = iVar13 << ((char)uVar1 - bVar9 & 0x1f);
      uVar16 = uVar20 >> 0x18 | (uVar20 & 0xff0000) >> 8 | (uVar20 & 0xff00) << 8 | uVar20 << 0x18;
      uVar16 = (uVar16 & 0xf0f0f0f) << 4 | uVar16 >> 4 & 0xf0f0f0f;
      uVar16 = (uVar16 >> 2 & 0x33333333) + (uVar16 & 0x33333333) * 4;
      uVar16 = (uVar16 >> 1 & 0x55555555) + (uVar16 & 0x55555555) * 2;
      uVar19 = uVar14;
      lVar8 = lVar21;
      if (poVar3[uVar16] == 0) {
        do {
          uVar14 = uVar19;
          if (lVar10 <= (long)(uVar14 + 1)) break;
          uVar19 = uVar14 + 1;
        } while (c->codelist[uVar14 + 1] <= uVar20);
        lVar18 = lVar10;
        if (lVar10 < lVar21) {
          lVar18 = lVar21;
        }
        for (; (lVar8 = lVar18, lVar18 != lVar21 &&
               (lVar8 = lVar21,
               (c->codelist[lVar21] & (uint)(0xfffffffeL << (0x1f - bVar9 & 0x3f))) <= uVar20));
            lVar21 = lVar21 + 1) {
        }
        uVar15 = lVar10 - lVar8;
        uVar19 = 0x7fff;
        if (uVar14 < 0x7fff) {
          uVar19 = uVar14;
        }
        if (0x7ffe < uVar15) {
          uVar15 = 0x7fff;
        }
        poVar3[uVar16] = (uint)uVar15 | (int)uVar19 << 0xf | 0x80000000;
      }
      lVar21 = lVar8;
    }
  }
  return 0;
}

Assistant:

int vorbis_book_init_decode(codebook *c,const static_codebook *s){
  int i,j,n=0,tabn;
  int *sortindex;
  memset(c,0,sizeof(*c));
  
  /* count actually used entries */
  for(i=0;i<s->entries;i++)
    if(s->lengthlist[i]>0)
      n++;

  c->entries=s->entries;
  c->used_entries=n;
  c->dim=s->dim;

  if(n>0){
    /* two different remappings go on here.  
       
       First, we collapse the likely sparse codebook down only to
       actually represented values/words.  This collapsing needs to be
       indexed as map-valueless books are used to encode original entry
       positions as integers.
       
       Second, we reorder all vectors, including the entry index above,
       by sorted bitreversed codeword to allow treeless decode. */
    
    /* perform sort */
    ogg_uint32_t *codes=_make_words(s->lengthlist,s->entries,c->used_entries);
    ogg_uint32_t **codep=(ogg_uint32_t **)alloca(sizeof(*codep)*n);
    
    if(codes==NULL)goto err_out;

    for(i=0;i<n;i++){
      codes[i]=bitreverse(codes[i]);
      codep[i]=codes+i;
    }

    qsort(codep,n,sizeof(*codep),sort32a);

    sortindex=(int *)alloca(n*sizeof(*sortindex));
    c->codelist=(ogg_uint32_t *)_ogg_malloc(n*sizeof(*c->codelist));
    /* the index is a reverse index */
    for(i=0;i<n;i++){
      int position=codep[i]-codes;
      sortindex[position]=i;
    }

    for(i=0;i<n;i++)
      c->codelist[sortindex[i]]=codes[i];
    _ogg_free(codes);
    
    
    
    c->valuelist=_book_unquantize(s,n,sortindex,&c->binarypoint);
    c->dec_index=(int *)_ogg_malloc(n*sizeof(*c->dec_index));
    
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_index[sortindex[n++]]=i;
    
    c->dec_codelengths=(char *)_ogg_malloc(n*sizeof(*c->dec_codelengths));
    for(n=0,i=0;i<s->entries;i++)
      if(s->lengthlist[i]>0)
	c->dec_codelengths[sortindex[n++]]=s->lengthlist[i];
    
    c->dec_firsttablen=_ilog(c->used_entries)-4; /* this is magic */
    if(c->dec_firsttablen<5)c->dec_firsttablen=5;
    if(c->dec_firsttablen>8)c->dec_firsttablen=8;
    
    tabn=1<<c->dec_firsttablen;
    c->dec_firsttable=(ogg_uint32_t *)_ogg_calloc(tabn,sizeof(*c->dec_firsttable));
    c->dec_maxlength=0;
    
    for(i=0;i<n;i++){
      if(c->dec_maxlength<c->dec_codelengths[i])
	c->dec_maxlength=c->dec_codelengths[i];
      if(c->dec_codelengths[i]<=c->dec_firsttablen){
	ogg_uint32_t orig=bitreverse(c->codelist[i]);
	for(j=0;j<(1<<(c->dec_firsttablen-c->dec_codelengths[i]));j++)
	  c->dec_firsttable[orig|(j<<c->dec_codelengths[i])]=i+1;
      }
    }
    
    /* now fill in 'unused' entries in the firsttable with hi/lo search
       hints for the non-direct-hits */
    {
      ogg_uint32_t mask=0xfffffffeUL<<(31-c->dec_firsttablen);
      long lo=0,hi=0;
      
      for(i=0;i<tabn;i++){
	ogg_uint32_t word=i<<(32-c->dec_firsttablen);
	if(c->dec_firsttable[bitreverse(word)]==0){
	  while((lo+1)<n && c->codelist[lo+1]<=word)lo++;
	  while(    hi<n && word>=(c->codelist[hi]&mask))hi++;
	  
	  /* we only actually have 15 bits per hint to play with here.
	     In order to overflow gracefully (nothing breaks, efficiency
	     just drops), encode as the difference from the extremes. */
	  {
	    unsigned long loval=lo;
	    unsigned long hival=n-hi;
	    
	    if(loval>0x7fff)loval=0x7fff;
	    if(hival>0x7fff)hival=0x7fff;
	    c->dec_firsttable[bitreverse(word)]=
	      0x80000000UL | (loval<<15) | hival;
	  }
	}
      }
    }
  }

  return(0);
 err_out:
  vorbis_book_clear(c);
  return(-1);
}